

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.h
# Opt level: O0

size_t __thiscall google::protobuf::UnknownField::GetLengthDelimitedSize(UnknownField *this)

{
  Type TVar1;
  LogMessage *other;
  size_t sVar2;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  UnknownField *local_10;
  UnknownField *this_local;
  
  local_10 = this;
  TVar1 = type(this);
  local_49 = 0;
  if (TVar1 != TYPE_LENGTH_DELIMITED) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
               ,0x15f);
    local_49 = 1;
    other = internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: (TYPE_LENGTH_DELIMITED) == (type()): ");
    internal::LogFinisher::operator=(local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_48);
  }
  sVar2 = std::__cxx11::string::size();
  return sVar2;
}

Assistant:

inline size_t UnknownField::GetLengthDelimitedSize() const {
  GOOGLE_DCHECK_EQ(TYPE_LENGTH_DELIMITED, type());
  return data_.length_delimited_.string_value_->size();
}